

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.cpp
# Opt level: O1

bool __thiscall duckdb::Hugeint::TrySubtractInPlace(Hugeint *this,hugeint_t *lhs,hugeint_t rhs)

{
  hugeint_t *phVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = rhs.lower;
  phVar1 = *(hugeint_t **)this;
  lVar2 = *(long *)(this + 8);
  if ((long)uVar3 < 0) {
    if ((lVar2 != -0x8000000000000000) &&
       ((long)(uVar3 + (phVar1 < lhs) + 0x7fffffffffffffff) < lVar2)) {
      return false;
    }
  }
  else if (lVar2 < (long)((uVar3 | 0x8000000000000000) + (ulong)(phVar1 < lhs))) {
    return false;
  }
  *(ulong *)(this + 8) = (-uVar3 - (ulong)(phVar1 < lhs)) + lVar2;
  *(long *)this = (long)phVar1 - (long)lhs;
  return true;
}

Assistant:

bool Hugeint::TrySubtractInPlace(hugeint_t &lhs, hugeint_t rhs) {
	// underflow
	int underflow = lhs.lower - rhs.lower > lhs.lower;
	if (rhs.upper >= 0) {
		// RHS is positive: check for underflow
		if (lhs.upper < (std::numeric_limits<int64_t>::min() + rhs.upper + underflow)) {
			return false;
		}
		lhs.upper = (lhs.upper - rhs.upper) - underflow;
	} else {
		// RHS is negative: check for overflow
		if (lhs.upper > std::numeric_limits<int64_t>::min() &&
		    lhs.upper - 1 >= (std::numeric_limits<int64_t>::max() + rhs.upper + underflow)) {
			return false;
		}
		lhs.upper = lhs.upper - (rhs.upper + underflow);
	}
	lhs.lower -= rhs.lower;
	return true;
}